

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

void __thiscall re2::TestInstance::~TestInstance(TestInstance *this)

{
  Prog *pPVar1;
  PCRE *this_00;
  RE2 *this_01;
  TestInstance *this_local;
  
  if (this->regexp_ != (Regexp *)0x0) {
    Regexp::Decref(this->regexp_);
  }
  pPVar1 = this->prog_;
  if (pPVar1 != (Prog *)0x0) {
    Prog::~Prog(pPVar1);
    operator_delete(pPVar1);
  }
  pPVar1 = this->rprog_;
  if (pPVar1 != (Prog *)0x0) {
    Prog::~Prog(pPVar1);
    operator_delete(pPVar1);
  }
  this_00 = this->re_;
  if (this_00 != (PCRE *)0x0) {
    PCRE::~PCRE(this_00);
    operator_delete(this_00);
  }
  this_01 = this->re2_;
  if (this_01 != (RE2 *)0x0) {
    RE2::~RE2(this_01);
    operator_delete(this_01);
  }
  return;
}

Assistant:

TestInstance::~TestInstance() {
  if (regexp_)
    regexp_->Decref();
  delete prog_;
  delete rprog_;
  delete re_;
  delete re2_;
}